

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

void uv_disable_stdio_inheritance(void)

{
  int iVar1;
  uint fd;
  uint uVar2;
  bool bVar3;
  
  fd = 0;
  do {
    do {
      iVar1 = uv__cloexec_ioctl(fd,1);
      uVar2 = fd + 1;
      bVar3 = fd < 0x10;
      fd = uVar2;
    } while (bVar3);
  } while (iVar1 == 0);
  return;
}

Assistant:

void uv_disable_stdio_inheritance(void) {
  int fd;

  /* Set the CLOEXEC flag on all open descriptors. Unconditionally try the
   * first 16 file descriptors. After that, bail out after the first error.
   */
  for (fd = 0; ; fd++)
    if (uv__cloexec(fd, 1) && fd > 15)
      break;
}